

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  Mat x0_lat;
  Mat x0_long;
  Mat ail_input;
  Mat elev_input;
  string filename;
  Mat ctrl_input_lat;
  Mat ctrl_input_long;
  RK4 Lat_Dyn_Integrate;
  RK4 Long_Dyn_Integrate;
  ofstream outputs_file;
  Mat local_470;
  double local_460;
  double local_458;
  Mat local_450;
  Mat local_440;
  Mat local_430;
  long *local_420 [2];
  long local_410 [2];
  Mat local_400;
  Mat local_3f0;
  Mat local_3e0;
  Mat local_3d0;
  RK4 local_3c0;
  RK4 local_2f8;
  double local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_230 = 0.0;
  Mat::Mat(&local_450,4,&local_230);
  local_230 = 0.0;
  Mat::Mat(&local_470,5,&local_230);
  local_230 = 0.0;
  Mat::Mat(&local_430,100,&local_230);
  dVar4 = 0.0;
  if (0.0 < t_sim / time_step) {
    lVar2 = 0;
    do {
      dVar4 = sin(time_step * 3.14159265 * dVar4);
      local_430.v_[lVar2] = dVar4 * 0.0872664625;
      lVar2 = lVar2 + 1;
      dVar4 = (double)(int)lVar2;
    } while (dVar4 < t_sim / time_step);
  }
  Mat::Transpose(&local_3d0);
  local_230 = 0.0;
  Mat::Mat(&local_440,100,&local_230);
  dVar4 = 0.0;
  if (0.0 < t_sim / time_step) {
    lVar2 = 0;
    do {
      dVar4 = sin(time_step * 3.14159265 * dVar4);
      local_440.v_[lVar2] = dVar4 * 0.0872664625;
      lVar2 = lVar2 + 1;
      dVar4 = (double)(int)lVar2;
    } while (dVar4 < t_sim / time_step);
  }
  Mat::Transpose(&local_3e0);
  iVar3 = n_eqs_long;
  local_458 = t_init;
  local_460 = t_sim;
  Mat::Mat(&local_3f0,&local_450);
  RK4::RK4(&local_2f8,LongDynXdot,iVar3,local_458,local_460,&local_3f0,time_step,&local_3d0);
  Mat::~Mat(&local_3f0);
  RK4::Integrate(&local_2f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Long dynamics integration finished.",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  iVar3 = n_eqs_lat;
  local_458 = t_init;
  local_460 = t_sim;
  Mat::Mat(&local_400,&local_470);
  RK4::RK4(&local_3c0,LatDynXdot,iVar3,local_458,local_460,&local_400,time_step,&local_3e0);
  Mat::~Mat(&local_400);
  RK4::Integrate(&local_3c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Lat dynamics integration finished.",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Final long state is: ",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  Mat::Print(&local_2f8.y_out_,"Output");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Final lat state is: ",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  Mat::Print(&local_3c0.y_out_,"Output");
  std::ofstream::ofstream(&local_230);
  local_420[0] = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"sim_out.csv","");
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)local_420);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"time",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"u_mps",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"w_mps",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"q_dps",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"theta_deg",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"v",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"p_dps",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"r_dps",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"phi_deg",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"psi_deg",7);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)((long)local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  dVar4 = 0.0;
  if (0.0 <= t_sim / time_step) {
    lVar2 = 0;
    do {
      if (lVar2 == 0) {
        poVar1 = std::ostream::_M_insert<double>(0.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>(*local_450.v_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>(local_450.v_[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>(local_450.v_[2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>(local_450.v_[3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>(*local_470.v_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>(local_470.v_[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>(local_470.v_[2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>(local_470.v_[3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>(local_470.v_[4]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      }
      else {
        poVar1 = std::ostream::_M_insert<double>(dVar4 * time_step);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>(local_2f8.Y_Out_.v_[lVar2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        iVar3 = (int)lVar2;
        poVar1 = std::ostream::_M_insert<double>
                           (local_2f8.Y_Out_.v_[local_2f8.Y_Out_.n_cols_ + iVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>
                           ((local_2f8.Y_Out_.v_[iVar3 + local_2f8.Y_Out_.n_cols_ * 2] * 180.0) /
                            3.14159265);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>
                           ((local_2f8.Y_Out_.v_[local_2f8.Y_Out_.n_cols_ * 3 + iVar3] * 180.0) /
                            3.14159265);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>(local_3c0.Y_Out_.v_[lVar2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>
                           ((local_3c0.Y_Out_.v_[local_3c0.Y_Out_.n_cols_ + iVar3] * 180.0) /
                            3.14159265);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>
                           ((local_3c0.Y_Out_.v_[iVar3 + local_3c0.Y_Out_.n_cols_ * 2] * 180.0) /
                            3.14159265);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>
                           ((local_3c0.Y_Out_.v_[local_3c0.Y_Out_.n_cols_ * 3 + iVar3] * 180.0) /
                            3.14159265);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<double>
                           ((local_3c0.Y_Out_.v_[iVar3 + local_3c0.Y_Out_.n_cols_ * 4] * 180.0) /
                            3.14159265);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      }
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      lVar2 = lVar2 + 1;
      dVar4 = (double)(int)lVar2;
    } while (dVar4 <= t_sim / time_step);
  }
  std::ofstream::close();
  if (local_420[0] != local_410) {
    operator_delete(local_420[0],local_410[0] + 1);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)((long)_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  Mat::~Mat(&local_3c0.k_4_);
  Mat::~Mat(&local_3c0.k_3_);
  Mat::~Mat(&local_3c0.k_2_);
  Mat::~Mat(&local_3c0.k_1_);
  Mat::~Mat(&local_3c0.u_vec_);
  Mat::~Mat(&local_3c0.y_0_);
  Mat::~Mat(&local_3c0.Y_Out_);
  Mat::~Mat(&local_3c0.y_out_);
  Mat::~Mat(&local_2f8.k_4_);
  Mat::~Mat(&local_2f8.k_3_);
  Mat::~Mat(&local_2f8.k_2_);
  Mat::~Mat(&local_2f8.k_1_);
  Mat::~Mat(&local_2f8.u_vec_);
  Mat::~Mat(&local_2f8.y_0_);
  Mat::~Mat(&local_2f8.Y_Out_);
  Mat::~Mat(&local_2f8.y_out_);
  Mat::~Mat(&local_3e0);
  Mat::~Mat(&local_440);
  Mat::~Mat(&local_3d0);
  Mat::~Mat(&local_430);
  Mat::~Mat(&local_470);
  Mat::~Mat(&local_450);
  return 0;
}

Assistant:

int main()
{   
    // Define initial state
    Mat x0_long(4, 0.0);
    Mat x0_lat(5, 0.0);

    // Define the control inputs
    Mat elev_input(100, 0.0);
    double elev_amplitude = 5 * PI / 180;
    double elev_freq_rps = PI;
    for (int i = 0; i < t_sim/time_step; i++) {
        elev_input(i) = elev_amplitude * sin(elev_freq_rps * time_step * i);
    }
    Mat ctrl_input_long = elev_input.Transpose();

    Mat ail_input(100, 0.0);
    double ail_amplitude = 5 * PI / 180;
    double ail_freq_rps = PI;
    for (int i = 0; i < t_sim/time_step; i++) {
        ail_input(i) = ail_amplitude * sin(ail_freq_rps * time_step * i);
    }
    Mat ctrl_input_lat = ail_input.Transpose();

    // Perform numerical integration
    RK4 Long_Dyn_Integrate(LongDynXdot, n_eqs_long, t_init, t_sim, x0_long, time_step, ctrl_input_long);
    Long_Dyn_Integrate.Integrate();
    std::cout << "Long dynamics integration finished." << std::endl;

    RK4 Lat_Dyn_Integrate(LatDynXdot, n_eqs_lat, t_init, t_sim, x0_lat, time_step, ctrl_input_lat);
    Lat_Dyn_Integrate.Integrate();
    std::cout << "Lat dynamics integration finished." << std::endl;

    // Display results
    std::cout << "Final long state is: " << std::endl;
    Long_Dyn_Integrate.y_out_.Print("Output");

    std::cout << "Final lat state is: " << std::endl;
    Lat_Dyn_Integrate.y_out_.Print("Output");

    // Create a csv file and save output data
    std::ofstream outputs_file;
    std::string filename = "sim_out.csv";
    outputs_file.open(filename);
    outputs_file << "time" << "," << "u_mps" << "," << "w_mps" << "," 
                 << "q_dps" << "," << "theta_deg" << ","
                 << "v" << "," << "p_dps" << "," << "r_dps" << ","
                 << "phi_deg" << "," << "psi_deg" << std::endl;
    for (int i = 0; i <= t_sim/time_step; i++) {
        if (i == 0) {
            outputs_file << 0.0 << "," << x0_long(0) << "," << x0_long(1) << "," 
                         << x0_long(2) << "," << x0_long(3) << ","
                         << x0_lat(0) << "," << x0_lat(1) << "," << x0_lat(2) << ","
                         << x0_lat(3) << "," << x0_lat(4) << std::endl;
        } else {
            outputs_file << time_step * i << "," 
                         << Long_Dyn_Integrate.Y_Out_(0, i) << ","
                         << Long_Dyn_Integrate.Y_Out_(1, i) << ","
                         << Long_Dyn_Integrate.Y_Out_(2, i) * 180.0 / PI << ","
                         << Long_Dyn_Integrate.Y_Out_(3, i) * 180.0 / PI << ","
                         << Lat_Dyn_Integrate.Y_Out_(0, i) << ","
                         << Lat_Dyn_Integrate.Y_Out_(1, i) * 180.0 / PI << ","
                         << Lat_Dyn_Integrate.Y_Out_(2, i) * 180.0 / PI << ","
                         << Lat_Dyn_Integrate.Y_Out_(3, i) * 180.0 / PI << ","
                         << Lat_Dyn_Integrate.Y_Out_(4, i) * 180.0 / PI << std::endl;
        }
        
    }

    // Close the output csv file
    outputs_file.close();
    
    return 0; 
}